

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chipset_intel_ich8.cc
# Opt level: O3

BiosCntl __thiscall security::pawn::IntelIch8Chipset::ReadBiosCntlRegister(IntelIch8Chipset *this)

{
  byte bVar1;
  BiosCntl BVar2;
  
  bVar1 = Pci::ReadConfigUint8((this->super_Chipset).pci_,0x8000f8dc);
  BVar2._0_1_ = (bVar1 & 1) << 5 | bVar1 * '\b' & 0x10 | bVar1 & 0xc | bVar1 >> 3 & 2;
  BVar2._1_3_ = 0;
  return BVar2;
}

Assistant:

Chipset::BiosCntl IntelIch8Chipset::ReadBiosCntlRegister() {
  auto bios_cntl = pci().ReadConfigUint8(kBiosCntlRegister);
  return {
      0,                         // Reserved, SMM_BWP on PCH platforms.
      bits::Test<4>(bios_cntl),  // TSS
      static_cast<Chipset::SpiReadConfiguration>(bits::Value<3, 2>(
          bios_cntl)),           // SRC, these bits map directly for ICH8.
      bits::Test<1>(bios_cntl),  // BLE
      bits::Test<0>(bios_cntl),  // BWE
  };
}